

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O1

int __thiscall QStatusBar::insertWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  char local_68 [24];
  char *local_50;
  SBItem local_48;
  long local_30;
  ulong uVar7;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    index = -1;
  }
  else {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    local_48.category = Normal;
    local_48.stretch = stretch;
    uVar7 = *(ulong *)(lVar1 + 0x268);
    uVar4 = (int)uVar7 - 1;
    uVar5 = uVar7;
    uVar3 = 0xffffffff;
    if ((int)uVar4 < -1) {
      uVar3 = uVar4;
    }
    do {
      uVar5 = uVar5 - 1;
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      uVar4 = uVar3;
      if ((int)uVar6 < 0) break;
      uVar4 = uVar6;
    } while (*(int *)(*(long *)(lVar1 + 0x260) + 0xc + (ulong)((uint)uVar5 & 0x7fffffff) * 0x10) ==
             1);
    local_48.widget = widget;
    if (((index < 0) || (*(ulong *)(lVar1 + 0x268) < (ulong)(uint)index)) ||
       ((int)(uVar4 + 1) < index && -1 < (int)uVar4)) {
      local_68[0] = '\x02';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      local_68[8] = '\0';
      local_68[9] = '\0';
      local_68[10] = '\0';
      local_68[0xb] = '\0';
      local_68[0xc] = '\0';
      local_68[0xd] = '\0';
      local_68[0xe] = '\0';
      local_68[0xf] = '\0';
      local_68[0x10] = '\0';
      local_68[0x11] = '\0';
      local_68[0x12] = '\0';
      local_68[0x13] = '\0';
      local_68[0x14] = '\0';
      local_68[0x15] = '\0';
      local_68[0x16] = '\0';
      local_68[0x17] = '\0';
      local_50 = "default";
      QMessageLogger::warning
                (local_68,"QStatusBar::insertWidget: Index out of range (%d), appending widget",
                 (ulong)(uint)index);
      index = uVar4 + 1;
    }
    QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::
    emplace<QStatusBarPrivate::SBItem_const&>
              ((QMovableArrayOps<QStatusBarPrivate::SBItem> *)(lVar1 + 600),(long)index,&local_48);
    QList<QStatusBarPrivate::SBItem>::begin((QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600));
    if (*(long *)(lVar1 + 0x280) != 0) {
      QWidget::hide(widget);
    }
    reformat(this);
    bVar2 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar2) {
      QWidget::show(widget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return index;
}

Assistant:

int QStatusBar::insertWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Normal};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index > idx + 1))) {
        qWarning("QStatusBar::insertWidget: Index out of range (%d), appending widget", index);
        index = idx + 1;
    }
    d->items.insert(index, item);

    if (!d->tempItem.isEmpty())
        widget->hide();

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}